

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

void bolt_pict(wchar_t y,wchar_t x,wchar_t ny,wchar_t nx,wchar_t typ,uint8_t *a,wchar_t *c)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  if (nx == x) {
    uVar1 = (ulong)(nx != x || ny != y);
  }
  else {
    iVar2 = ny - y;
    bVar3 = iVar2 == x - nx;
    if (ny == y || bVar3) {
      uVar1 = (ulong)bVar3 ^ 3;
    }
    else {
      uVar1 = (ulong)(iVar2 == nx - x) << 2;
    }
  }
  if (use_graphics != L'\0') {
    *a = proj_to_attr[typ][uVar1];
    *c = proj_to_char[typ][uVar1];
    return;
  }
  *c = *(wchar_t *)(&DAT_0023c780 + uVar1 * 4);
  *a = (uint8_t)projections[typ].color;
  return;
}

Assistant:

static void bolt_pict(int y, int x, int ny, int nx, int typ, uint8_t *a,
					  wchar_t *c)
{
	int motion;

	/* Convert co-ordinates into motion */
	if ((ny == y) && (nx == x))
		motion = BOLT_NO_MOTION;
	else if (nx == x)
		motion = BOLT_0;
	else if ((ny-y) == (x-nx))
		motion = BOLT_45;
	else if (ny == y)
		motion = BOLT_90;
	else if ((ny-y) == (nx-x))
		motion = BOLT_135;
	else
		motion = BOLT_NO_MOTION;

	/* Decide on output char */
	if (use_graphics == GRAPHICS_NONE) {
		/* ASCII is simple */
		wchar_t chars[] = L"*|/-\\";

		*c = chars[motion];
		*a = projections[typ].color;
	} else {
		*a = proj_to_attr[typ][motion];
		*c = proj_to_char[typ][motion];
	}
}